

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

double units::generateLeadingNumber(string *ustring,size_t *index)

{
  byte bVar1;
  pointer pcVar2;
  bool bVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  double dVar8;
  size_t oindex;
  double local_58;
  string local_50;
  
  *index = 0;
  dVar8 = getNumberBlock(ustring,index);
  if (NAN(dVar8)) {
    *index = 0;
  }
  else {
    uVar7 = *index;
    while (uVar7 < ustring->_M_string_length) {
      pcVar2 = (ustring->_M_dataplus)._M_p;
      bVar1 = pcVar2[uVar7];
      uVar4 = (ulong)bVar1;
      if (uVar4 < 0x30) {
        if ((0x840000000000U >> (uVar4 & 0x3f) & 1) != 0) goto LAB_00126df8;
        if (uVar4 != 0x28) {
          if ((0x680000000000U >> (uVar4 & 0x3f) & 1) != 0) {
            *index = 0;
            return NAN;
          }
          goto LAB_00126def;
        }
        oindex = 0;
        std::__cxx11::string::substr((ulong)&local_50,(ulong)ustring);
        local_58 = getNumberBlock(&local_50,&oindex);
        std::__cxx11::string::~string((string *)&local_50);
        if (NAN(local_58)) {
          return dVar8;
        }
        dVar8 = dVar8 * local_58;
        sVar5 = oindex;
        sVar6 = *index;
      }
      else {
LAB_00126def:
        if (bVar1 != 0x78) {
          return dVar8;
        }
LAB_00126df8:
        bVar3 = looksLikeNumber(ustring,uVar7 + 1);
        if ((!bVar3) && (pcVar2[uVar7 + 1] != '(')) {
          return dVar8;
        }
        oindex = 0;
        std::__cxx11::string::substr((ulong)&local_50,(ulong)ustring);
        local_58 = getNumberBlock(&local_50,&oindex);
        std::__cxx11::string::~string((string *)&local_50);
        if (NAN(local_58)) {
          return dVar8;
        }
        sVar5 = *index;
        sVar6 = oindex;
        if ((ustring->_M_dataplus)._M_p[sVar5] == '/') {
          dVar8 = dVar8 / local_58;
        }
        else {
          dVar8 = dVar8 * local_58;
        }
      }
      uVar7 = sVar5 + sVar6 + 1;
      *index = uVar7;
    }
  }
  return dVar8;
}

Assistant:

double generateLeadingNumber(const std::string& ustring, size_t& index) noexcept
{
    index = 0;
    double val = getNumberBlock(ustring, index);
    if (std::isnan(val)) {
        index = 0;
        return val;
    }
    while (true) {
        if (index >= ustring.size()) {
            return val;
        }
        switch (ustring[index]) {
            case '.':
            case '-':
            case '+':
                index = 0;
                return constants::invalid_conversion;
            case '/':
            case '*':
            case 'x':
                if (looksLikeNumber(ustring, index + 1) ||
                    ustring[index + 1] == '(') {
                    size_t oindex{0};
                    double res =
                        getNumberBlock(ustring.substr(index + 1), oindex);
                    if (!std::isnan(res)) {
                        if (ustring[index] == '/') {
                            val /= res;
                        } else {
                            val *= res;
                        }

                        index = oindex + index + 1;
                    } else {
                        return val;
                    }
                } else {
                    return val;
                }
                break;
            case '(': {
                size_t oindex{0};
                double res = getNumberBlock(ustring.substr(index), oindex);
                if (!std::isnan(res)) {
                    val *= res;
                    index = oindex + index + 1;
                } else {
                    return val;
                }
                break;
            }
            default:
                return val;
        }
    }
}